

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReportWarning(ColladaParser *this,char *msg,...)

{
  char in_AL;
  uint uVar1;
  Logger *this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char szBuffer [3000];
  undefined1 *local_e58 [2];
  undefined1 local_e48 [16];
  char *local_e38 [4];
  undefined8 local_e18;
  undefined1 *local_e10;
  undefined1 *local_e08;
  undefined1 local_df8 [16];
  undefined8 local_de8;
  undefined8 local_de0;
  undefined8 local_dd8;
  undefined8 local_dd0;
  undefined8 local_dc8;
  undefined8 local_db8;
  undefined8 local_da8;
  undefined8 local_d98;
  undefined8 local_d88;
  undefined8 local_d78;
  undefined8 local_d68;
  undefined8 local_d58;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_d40;
  char local_bc8 [3000];
  
  if (in_AL != '\0') {
    local_dc8 = in_XMM0_Qa;
    local_db8 = in_XMM1_Qa;
    local_da8 = in_XMM2_Qa;
    local_d98 = in_XMM3_Qa;
    local_d88 = in_XMM4_Qa;
    local_d78 = in_XMM5_Qa;
    local_d68 = in_XMM6_Qa;
    local_d58 = in_XMM7_Qa;
  }
  local_de8 = in_RDX;
  local_de0 = in_RCX;
  local_dd8 = in_R8;
  local_dd0 = in_R9;
  if (msg != (char *)0x0) {
    local_e08 = local_df8;
    local_e10 = &stack0x00000008;
    local_e18 = 0x3000000010;
    uVar1 = vsprintf(local_bc8,msg,&local_e18);
    if (0 < (int)uVar1) {
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[21]>(&local_d40,(char (*) [21])"Validation warning: ");
      local_e58[0] = local_e48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e58,local_bc8,local_bc8 + uVar1);
      std::operator<<((ostream *)&local_d40,(string *)local_e58);
      std::__cxx11::stringbuf::str();
      Logger::warn(this_00,local_e38[0]);
      std::__cxx11::string::~string((string *)local_e38);
      std::__cxx11::string::~string((string *)local_e58);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_d40);
      return;
    }
    __assert_fail("iLen > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                  ,0xcb8,"void Assimp::ColladaParser::ReportWarning(const char *, ...)");
  }
  __assert_fail("nullptr != msg",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                ,0xcb1,"void Assimp::ColladaParser::ReportWarning(const char *, ...)");
}

Assistant:

void ColladaParser::ReportWarning(const char* msg, ...) {
    ai_assert(nullptr != msg);

    va_list args;
    va_start(args, msg);

    char szBuffer[3000];
    const int iLen = vsprintf(szBuffer, msg, args);
    ai_assert(iLen > 0);

    va_end(args);
    ASSIMP_LOG_WARN_F("Validation warning: ", std::string(szBuffer, iLen));
}